

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

HighsTripletPositionSlice * __thiscall
presolve::HPresolve::getStoredRow(HighsTripletPositionSlice *__return_storage_ptr__,HPresolve *this)

{
  pointer pdVar1;
  pointer piVar2;
  pointer piVar3;
  
  pdVar1 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletPositionSlice>).nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletPositionSlice>).nodeValue = pdVar1;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletPositionSlice>).nodePositions = piVar2
  ;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletPositionSlice>).len =
       (HighsInt)((ulong)((long)piVar3 - (long)piVar2) >> 2);
  return __return_storage_ptr__;
}

Assistant:

HighsTripletPositionSlice HPresolve::getStoredRow() const {
  return HighsTripletPositionSlice(Acol.data(), Avalue.data(),
                                   rowpositions.data(), rowpositions.size());
}